

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cc
# Opt level: O0

void __thiscall UdpSocket::UdpSocket(UdpSocket *this,uint16_t port)

{
  pointer ptVar1;
  pointer __p;
  pointer __p_00;
  uint16_t port_local;
  UdpSocket *this_local;
  
  this->_port = port;
  std::unique_ptr<timeval,std::default_delete<timeval>>::
  unique_ptr<std::default_delete<timeval>,void>
            ((unique_ptr<timeval,std::default_delete<timeval>> *)&this->_read_time);
  std::unique_ptr<fd_set,std::default_delete<fd_set>>::unique_ptr<std::default_delete<fd_set>,void>
            ((unique_ptr<fd_set,std::default_delete<fd_set>> *)&this->_readset);
  std::unique_ptr<sockaddr_in,std::default_delete<sockaddr_in>>::
  unique_ptr<std::default_delete<sockaddr_in>,void>
            ((unique_ptr<sockaddr_in,std::default_delete<sockaddr_in>> *)&this->_read_addr);
  this->_recv_speed_bytes = 0;
  this->_print_time_ms = 0;
  this->_prior_recv_time = 0;
  InitSocket(this);
  ptVar1 = (pointer)operator_new(0x10);
  std::unique_ptr<timeval,_std::default_delete<timeval>_>::reset(&this->_read_time,ptVar1);
  ptVar1 = std::unique_ptr<timeval,_std::default_delete<timeval>_>::operator->(&this->_read_time);
  ptVar1->tv_sec = 1;
  ptVar1 = std::unique_ptr<timeval,_std::default_delete<timeval>_>::operator->(&this->_read_time);
  ptVar1->tv_usec = 0;
  __p = (pointer)operator_new(0x80);
  std::unique_ptr<fd_set,_std::default_delete<fd_set>_>::reset(&this->_readset,__p);
  __p_00 = (pointer)operator_new(0x10);
  std::unique_ptr<sockaddr_in,_std::default_delete<sockaddr_in>_>::reset(&this->_read_addr,__p_00);
  return;
}

Assistant:

UdpSocket::UdpSocket(uint16_t port)
	: _port(port)
{
	InitSocket();
	_read_time.reset(new timeval);
	_read_time->tv_sec = 1;
	_read_time->tv_usec = 0;
	_readset.reset(new fd_set);
	_read_addr.reset(new sockaddr_in);
}